

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char16_t * strcpyU16(char16_t *s1,char16_t *s2)

{
  char16_t cVar1;
  char16_t *p2;
  char16_t *p1;
  char16_t *s2_local;
  char16_t *s1_local;
  
  if ((s1 != (char16_t *)0x0) && (p2 = s2, p1 = s1, s2 != (char16_t *)0x0)) {
    do {
      if (*p2 == 0) {
        cVar1 = 0;
      }
      else {
        cVar1 = *p2;
        p2 = p2 + 1;
      }
      *p1 = cVar1;
      p1 = p1 + 1;
    } while (*p2 != 0);
  }
  return s1;
}

Assistant:

char16_t *strcpyU16(char16_t *s1, const char16_t *s2)
{
	if (s1 == NULL || s2 == NULL)
	{
		return s1;
	}
	char16_t *p1 = s1;
	char16_t *p2 = (char16_t *)s2;
	do
	{
		*p1++ = (*p2) ? *p2++ : u'\0';
	} while (*p2);
	return s1;
}